

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChSolverPMINRES.cpp
# Opt level: O2

void __thiscall chrono::ChSolverPMINRES::ArchiveOUT(ChSolverPMINRES *this)

{
  ChArchiveOut *in_RSI;
  
  ArchiveOUT((ChSolverPMINRES *)&this[-1].grad_diffstep,in_RSI);
  return;
}

Assistant:

void ChSolverPMINRES::ArchiveOUT(ChArchiveOut& marchive) {
    // version number
    marchive.VersionWrite<ChSolverPMINRES>();
    // serialize parent class
    ChIterativeSolverVI::ArchiveOUT(marchive);
    // serialize all member data:
    marchive << CHNVP(grad_diffstep);
    marchive << CHNVP(rel_tolerance);
    marchive << CHNVP(m_use_precond);
}